

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

uint32_t __thiscall double_conversion::Single::Significand(Single *this)

{
  bool bVar1;
  uint32_t uVar2;
  Single *in_RDI;
  uint32_t significand;
  uint32_t d32;
  uint local_4;
  
  uVar2 = AsUint32(in_RDI);
  local_4 = uVar2 & 0x7fffff;
  bVar1 = IsDenormal(in_RDI);
  if (!bVar1) {
    local_4 = local_4 + 0x800000;
  }
  return local_4;
}

Assistant:

uint32_t Significand() const {
    uint32_t d32 = AsUint32();
    uint32_t significand = d32 & kSignificandMask;
    if (!IsDenormal()) {
      return significand + kHiddenBit;
    } else {
      return significand;
    }
  }